

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

bool __thiscall ONX_Model::SetDocumentUserString(ONX_Model *this,wchar_t *key,wchar_t *string_value)

{
  bool bVar1;
  ON_Object *this_00;
  
  if ((key != (wchar_t *)0x0) && (*key != L'\0')) {
    this_00 = &this->m_model_user_string_list->super_ON_Object;
    if (this_00 == (ON_Object *)0x0) {
      this_00 = (ON_Object *)::operator_new(0x10);
      ON_DocumentUserStringList::ON_DocumentUserStringList((ON_DocumentUserStringList *)this_00);
      this->m_model_user_string_list = (ON_DocumentUserStringList *)this_00;
    }
    bVar1 = ON_Object::SetUserString(this_00,key,string_value);
    return bVar1;
  }
  return false;
}

Assistant:

bool ONX_Model::SetDocumentUserString( const wchar_t* key, const wchar_t* string_value )
{
  if (nullptr == key || 0 == key[0] )
    return false;
  if ( nullptr == m_model_user_string_list )
    m_model_user_string_list = new ON_DocumentUserStringList();
  return m_model_user_string_list->SetUserString(key,string_value);
}